

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImgDisplay * __thiscall cimg_library::CImgDisplay::move(CImgDisplay *this,int posx,int posy)

{
  Display *pDVar1;
  int iVar2;
  CImgDisplay *pCVar3;
  
  if ((this->_width != 0) && (this->_height != 0)) {
    show(this);
    if ((this->_window_x != posx) || (this->_window_y != posy)) {
      if (cimg::X11_attr()::val == '\0') {
        iVar2 = __cxa_guard_acquire(&cimg::X11_attr()::val);
        if (iVar2 != 0) {
          cimg::X11_static::X11_static(&cimg::X11_attr::val);
          __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
          __cxa_guard_release(&cimg::X11_attr()::val);
        }
      }
      pDVar1 = cimg::X11_attr::val.display;
      if (cimg::Mutex_attr()::val == '\0') {
        move();
      }
      pthread_mutex_lock((pthread_mutex_t *)(cimg::Mutex_attr()::val + 600));
      XMoveWindow(pDVar1,this->_window,posx,posy);
      this->_window_x = posx;
      this->_window_y = posy;
      if (cimg::Mutex_attr()::val == '\0') {
        move();
      }
      pthread_mutex_unlock((pthread_mutex_t *)(cimg::Mutex_attr()::val + 600));
    }
    this->_is_moved = false;
    pCVar3 = paint(this,true);
    return pCVar3;
  }
  return this;
}

Assistant:

CImgDisplay& move(const int posx, const int posy) {
      if (is_empty()) return *this;
      show();
      if (_window_x!=posx || _window_y!=posy) {
        Display *const dpy = cimg::X11_attr().display;
        cimg_lock_display();
        XMoveWindow(dpy,_window,posx,posy);
        _window_x = posx;
        _window_y = posy;
        cimg_unlock_display();
      }
      _is_moved = false;
      return paint();
    }